

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void C_DrawConsole(bool hw2d)

{
  TObjPtr<AActor> *obj;
  uint uVar1;
  FBrokenLines **ppFVar2;
  ulong uVar3;
  FFont *this;
  DFrameBuffer *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  BYTE *pBVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  AActor *pAVar11;
  int iVar12;
  FBrokenLines **p;
  player_t *ppVar13;
  FBrokenLines **ppFVar14;
  FTexture *img;
  uint scale;
  int iVar15;
  int iVar16;
  int iVar17;
  double dVar18;
  int iVar19;
  undefined4 uVar20;
  int iVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  char tickstr [256];
  
  scale = con_scale.Value;
  if (con_scale.Value < 1) {
    iVar12 = CleanXfac;
    if (CleanXfac < 3) {
      iVar12 = 2;
    }
    scale = iVar12 - 1;
  }
  iVar12 = ConFont->FontHeight;
  iVar15 = (ConBottom / (int)scale + iVar12 * -2) / iVar12;
  if ((iVar12 * 7) / -2 + ConBottom / (int)scale < (iVar15 + -1) * iVar12) {
    iVar12 = iVar12 / -2;
    iVar15 = iVar15 + -1;
  }
  else {
    iVar12 = -iVar12;
  }
  if ((ConBottom < C_DrawConsole::oldbottom) &&
     ((((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)) &&
       (viewwindowy != 0 || viewwindowx != 0)) && (viewactive)))) {
    V_SetBorderNeedRefresh();
  }
  iVar16 = ConBottom;
  C_DrawConsole::oldbottom = ConBottom;
  if (ConsoleState != c_up) {
    if (ConBottom != 0) {
      iVar6 = 0;
      if ((uint)conback.texnum < TexMan.Textures.Count) {
        img = TexMan.Textures.Array[conback.texnum].Texture;
      }
      else {
        img = (FTexture *)0x0;
      }
      uVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      if (conshade != '\0') {
        iVar6 = -0x51000000;
      }
      if (gamestate == GS_FULLCONSOLE) {
        dVar18 = 1.0;
      }
      else {
        dVar18 = (double)con_alpha.Value;
      }
      if (!hw2d) {
        dVar18 = 1.0;
      }
      uVar23 = 0;
      uVar22 = 0;
      iVar21 = 0x400013a5;
      uVar20 = 0x4000138c;
      DCanvas::DrawTexture
                ((DCanvas *)screen,img,0.0,(double)(int)(ConBottom - uVar1),0x40001389,dVar18,
                 (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,0x4000138a,
                 (ulong)uVar1,0x400013aa,iVar6,0x4000138c,0x400013a5,0,0);
      if ((conline == '\x01') && (iVar16 < (screen->super_DSimpleCanvas).super_DCanvas.Height)) {
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (screen,0,(ulong)(uint)iVar16,
                   (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                   (ulong)(iVar16 + 1),0,0);
      }
      this_00 = screen;
      this = ConFont;
      if (0xb < ConBottom) {
        iVar16 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        if (scale == 1) {
          pBVar7 = (BYTE *)GetVersionString();
          iVar4 = FFont::StringWidth(this,pBVar7);
          iVar16 = iVar16 - iVar4;
          iVar4 = ConBottom - ConFont->FontHeight;
          pcVar8 = GetVersionString();
          iVar19 = 0;
        }
        else {
          pBVar7 = (BYTE *)GetVersionString();
          iVar6 = FFont::StringWidth(this,pBVar7);
          iVar16 = iVar16 / (int)scale - iVar6;
          iVar4 = ConBottom / (int)scale - ConFont->FontHeight;
          pcVar8 = GetVersionString();
          iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width / (int)scale;
          iVar21 = (screen->super_DSimpleCanvas).super_DCanvas.Height / (int)scale;
          uVar23 = 1;
          uVar22 = 0x400013a8;
          uVar20 = 0x4000139a;
          iVar19 = 0x40001399;
        }
        DCanvas::DrawText((DCanvas *)this_00,this,8,iVar16 + -8,iVar4 + -4,pcVar8,iVar19,iVar6,
                          uVar20,iVar21,uVar22,uVar23);
        pcVar8 = TickerLabel;
        if (TickerMax == 0) {
          TickerVisible = 0;
        }
        else {
          iVar17 = ConBottom / (int)scale;
          iVar16 = ConFont->FontHeight;
          iVar19 = 0;
          uVar3 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)(int)scale;
          iVar4 = ConCols / scale +
                  (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                       -0x5a) + -6;
          if (TickerLabel != (char *)0x0) {
            sVar9 = strlen(TickerLabel);
            iVar19 = (int)sVar9 + 2;
            mysnprintf(tickstr,0x100,"%s: ",pcVar8);
          }
          iVar5 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
          if (0x100 - iVar5 < iVar4) {
            iVar4 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
            iVar4 = 0x100 - iVar4;
          }
          tickstr[iVar19] = '\x10';
          memset(tickstr + (long)iVar19 + 1,0x11,(long)(iVar4 - iVar19));
          lVar10 = (long)iVar4;
          (tickstr + lVar10 + 1)[0] = '\x12';
          (tickstr + lVar10 + 1)[1] = ' ';
          if (TickerPercent == true) {
            mysnprintf(tickstr + lVar10 + 3,0xfd - lVar10,"%d%%",
                       ((long)(int)TickerAt * 100) / (long)(int)TickerMax & 0xffffffff);
          }
          else {
            tickstr[lVar10 + 3] = '\0';
          }
          iVar16 = (iVar17 - iVar16) + -4;
          if (scale == 1) {
            iVar17 = 0;
          }
          else {
            iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width / (int)scale;
            iVar21 = (screen->super_DSimpleCanvas).super_DCanvas.Height / (int)scale;
            uVar23 = 1;
            uVar22 = 0x400013a8;
            uVar20 = 0x4000139a;
            iVar17 = 0x40001399;
          }
          DCanvas::DrawText((DCanvas *)screen,ConFont,4,8,iVar16,tickstr,iVar17,iVar6,uVar20,iVar21,
                            uVar22,uVar23);
          if (scale == 1) {
            iVar17 = 0;
          }
          else {
            iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width / (int)scale;
            iVar21 = (screen->super_DSimpleCanvas).super_DCanvas.Height / (int)scale;
            uVar23 = 1;
            uVar22 = 0x400013a8;
            uVar20 = 0x4000139a;
            iVar17 = 0x40001399;
          }
          DCanvas::DrawChar((DCanvas *)screen,ConFont,8,
                            (int)(((long)((iVar4 - iVar19) * 8) * (long)(int)TickerAt) /
                                 (long)(int)TickerMax) + iVar19 * 8 + 0xd,iVar16,'\x13',iVar17,iVar6
                            ,uVar20,iVar21,uVar22,uVar23);
          TickerVisible = 1;
        }
      }
      if (StatusBar != (DBaseStatusBar *)0x0 && !hw2d) {
        ppVar13 = StatusBar->CPlayer;
        obj = &ppVar13->camera;
        pAVar11 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar11 != (AActor *)0x0) {
          pAVar11 = GC::ReadBarrier<AActor>((AActor **)obj);
          if (pAVar11->player != (player_t *)0x0) {
            pAVar11 = GC::ReadBarrier<AActor>((AActor **)obj);
            ppVar13 = pAVar11->player;
          }
        }
        if (((ppVar13->BlendA != 0.0) || (NAN(ppVar13->BlendA))) &&
           ((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)))) {
          (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                    (screen,(ulong)((int)(ppVar13->BlendB * 255.0) & 0xffU |
                                   ((int)(ppVar13->BlendG * 255.0) & 0xffU) << 8 |
                                   ((int)(ppVar13->BlendR * 255.0) & 0xffU) << 0x10),0,
                     (ulong)(uint)ConBottom,
                     (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                     (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Height - ConBottom));
          ST_SetNeedRefresh();
          V_SetBorderNeedRefresh();
        }
      }
    }
    if ((menuactive == MENU_Off) && (0 < iVar15)) {
      FConsoleBuffer::FormatText(conbuffer,ConFont,ConWidth / (int)scale);
      ppFVar2 = (conbuffer->mBrokenLines).Array;
      ppFVar14 = ppFVar2 + ((ulong)(uint)conbuffer->mTextLines - (long)RowAdjust);
      iVar6 = ConBottom / (int)scale;
      iVar16 = ConFont->FontHeight;
      ConsoleDrawing = 1;
      for (; (ppFVar14 = ppFVar14 + -1, ppFVar2 <= ppFVar14 && (0 < iVar15)); iVar15 = iVar15 + -1)
      {
        if (scale == 1) {
          iVar21 = 0;
        }
        else {
          iVar21 = 0x40001399;
        }
        DCanvas::DrawText((DCanvas *)screen,ConFont,1,8,ConFont->FontHeight * iVar15 + iVar12,
                          ((*ppFVar14)->Text).Chars,iVar21);
      }
      ConsoleDrawing = 0;
      if (0x13 < ConBottom) {
        iVar12 = iVar6 + iVar16 * -2 + -4;
        if (gamestate != GS_STARTUP) {
          FCommandBuffer::FCommandBuffer((FCommandBuffer *)tickstr,&CmdLine);
          FCommandBuffer::Draw((FCommandBuffer *)tickstr,8,iVar12,scale,cursoron);
          FString::~FString((FString *)tickstr);
        }
        if ((RowAdjust != 0) && ((ConFont->FontHeight * 7) / 2 <= ConBottom)) {
          if (scale == 1) {
            iVar15 = 0;
          }
          else {
            iVar15 = 0x40001399;
          }
          DCanvas::DrawChar((DCanvas *)screen,ConFont,3,0,iVar12,
                            (RowAdjust == conbuffer->mTextLines) * '\x02' + '\n',iVar15);
        }
      }
    }
    return;
  }
  FNotifyBuffer::Draw(&NotifyStrings);
  return;
}

Assistant:

void C_DrawConsole (bool hw2d)
{
	static int oldbottom = 0;
	int lines, left, offset;

	int textScale = active_con_scale();

	left = LEFTMARGIN;
	lines = (ConBottom/textScale-ConFont->GetHeight()*2)/ConFont->GetHeight();
	if (-ConFont->GetHeight() + lines*ConFont->GetHeight() > ConBottom/textScale - ConFont->GetHeight()*7/2)
	{
		offset = -ConFont->GetHeight()/2;
		lines--;
	}
	else
	{
		offset = -ConFont->GetHeight();
	}

	if ((ConBottom < oldbottom) &&
		(gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL) &&
		(viewwindowx || viewwindowy) &&
		viewactive)
	{
		V_SetBorderNeedRefresh();
	}

	oldbottom = ConBottom;

	if (ConsoleState == c_up)
	{
		NotifyStrings.Draw();
		return;
	}
	else if (ConBottom)
	{
		int visheight;
		FTexture *conpic = TexMan[conback];

		visheight = ConBottom;

		screen->DrawTexture (conpic, 0, visheight - screen->GetHeight(),
			DTA_DestWidth, screen->GetWidth(),
			DTA_DestHeight, screen->GetHeight(),
			DTA_ColorOverlay, conshade,
			DTA_AlphaF, (hw2d && gamestate != GS_FULLCONSOLE) ? (double)con_alpha : 1.,
			DTA_Masked, false,
			TAG_DONE);
		if (conline && visheight < screen->GetHeight())
		{
			screen->Clear (0, visheight, screen->GetWidth(), visheight+1, 0, 0);
		}

		if (ConBottom >= 12)
		{
			if (textScale == 1)
				screen->DrawText (ConFont, CR_ORANGE, SCREENWIDTH - 8 -
					ConFont->StringWidth (GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(), TAG_DONE);
			else
				screen->DrawText(ConFont, CR_ORANGE, SCREENWIDTH / textScale - 8 -
					ConFont->StringWidth(GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(),
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);

			if (TickerMax)
			{
				char tickstr[256];
				const int tickerY = ConBottom / textScale - ConFont->GetHeight() - 4;
				size_t i;
				int tickend = ConCols / textScale - SCREENWIDTH / textScale / 90 - 6;
				int tickbegin = 0;

				if (TickerLabel)
				{
					tickbegin = (int)strlen (TickerLabel) + 2;
					mysnprintf (tickstr, countof(tickstr), "%s: ", TickerLabel);
				}
				if (tickend > 256 - ConFont->GetCharWidth(0x12))
					tickend = 256 - ConFont->GetCharWidth(0x12);
				tickstr[tickbegin] = 0x10;
				memset (tickstr + tickbegin + 1, 0x11, tickend - tickbegin);
				tickstr[tickend + 1] = 0x12;
				tickstr[tickend + 2] = ' ';
				if (TickerPercent)
				{
					mysnprintf (tickstr + tickend + 3, countof(tickstr) - tickend - 3,
						"%d%%", Scale (TickerAt, 100, TickerMax));
				}
				else
				{
					tickstr[tickend+3] = 0;
				}
				if (textScale == 1)
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr, TAG_DONE);
				else
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				// Draw the marker
				i = LEFTMARGIN+5+tickbegin*8 + Scale (TickerAt, (SDWORD)(tickend - tickbegin)*8, TickerMax);
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_ORANGE, (int)i, tickerY, 0x13, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_ORANGE, (int)i, tickerY, 0x13,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				TickerVisible = true;
			}
			else
			{
				TickerVisible = false;
			}
		}

		// Apply palette blend effects
		if (StatusBar != NULL && !hw2d)
		{
			player_t *player = StatusBar->CPlayer;
			if (player->camera != NULL && player->camera->player != NULL)
			{
				player = player->camera->player;
			}
			if (player->BlendA != 0 && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
			{
				screen->Dim (PalEntry ((unsigned char)(player->BlendR*255), (unsigned char)(player->BlendG*255), (unsigned char)(player->BlendB*255)),
					player->BlendA, 0, ConBottom, screen->GetWidth(), screen->GetHeight() - ConBottom);
				ST_SetNeedRefresh();
				V_SetBorderNeedRefresh();
			}
		}
	}

	if (menuactive != MENU_Off)
	{
		return;
	}

	if (lines > 0)
	{
		// No more enqueuing because adding new text to the console won't touch the actual print data.
		conbuffer->FormatText(ConFont, ConWidth / textScale);
		unsigned int consolelines = conbuffer->GetFormattedLineCount();
		FBrokenLines **blines = conbuffer->GetLines();
		FBrokenLines **printline = blines + consolelines - 1 - RowAdjust;

		int bottomline = ConBottom / textScale - ConFont->GetHeight()*2 - 4;

		ConsoleDrawing = true;

		for(FBrokenLines **p = printline; p >= blines && lines > 0; p--, lines--)
		{
			if (textScale == 1)
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text, TAG_DONE);
			}
			else
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text,
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);
			}
		}

		ConsoleDrawing = false;

		if (ConBottom >= 20)
		{
			if (gamestate != GS_STARTUP)
			{
				// Make a copy of the command line, in case an input event is handled
				// while we draw the console and it changes.
				FCommandBuffer command(CmdLine);
				command.Draw(left, bottomline, textScale, cursoron);
			}
			if (RowAdjust && ConBottom >= ConFont->GetHeight()*7/2)
			{
				// Indicate that the view has been scrolled up (10)
				// and if we can scroll no further (12)
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);
			}
		}
	}
}